

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::write_char<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char value,basic_format_specs<char> *specs)

{
  buffer_appender<char> bVar1;
  anon_class_1_1_a8c68091 local_1;
  
  bVar1 = write_padded<(fmt::v7::align::type)1,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_char<char,fmt::v7::detail::buffer_appender<char>>(fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_specs<char>const&)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    (out,specs,1,&local_1);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write_char(OutputIt out, Char value,
                    const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, 1, [=](iterator it) {
    *it++ = value;
    return it;
  });
}